

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void notationDeclDebug(void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId)

{
  xmllintState *lint;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) != 0) {
    return;
  }
  fprintf(_stdout,"SAX.notationDecl(%s, %s, %s)\n",name,publicId,systemId);
  return;
}

Assistant:

static void
notationDeclDebug(void *ctx, const xmlChar *name,
	     const xmlChar *publicId, const xmlChar *systemId)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.notationDecl(%s, %s, %s)\n",
            (char *) name, (char *) publicId, (char *) systemId);
}